

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# div.cc
# Opt level: O3

int BN_mod_pow2(BIGNUM *r,BIGNUM *a,size_t e)

{
  size_t words;
  int iVar1;
  BIGNUM *pBVar2;
  ulong uVar3;
  
  if ((e == 0) || ((long)a->width == 0)) {
    BN_zero(r);
  }
  else {
    uVar3 = e - 1 >> 6;
    if ((ulong)(long)a->width <= uVar3) {
      pBVar2 = BN_copy((BIGNUM *)r,(BIGNUM *)a);
      return (uint)(pBVar2 != (BIGNUM *)0x0);
    }
    words = uVar3 + 1;
    iVar1 = bn_wexpand(r,words);
    if (iVar1 == 0) {
      return 0;
    }
    memcpy(r->d,a->d,words * 8);
    if ((e & 0x3f) != 0) {
      r->d[uVar3] = r->d[uVar3] & ~(-1L << (sbyte)(e & 0x3f));
    }
    r->neg = a->neg;
    r->width = (int)words;
    bn_set_minimal_width(r);
  }
  return 1;
}

Assistant:

int BN_mod_pow2(BIGNUM *r, const BIGNUM *a, size_t e) {
  if (e == 0 || a->width == 0) {
    BN_zero(r);
    return 1;
  }

  size_t num_words = 1 + ((e - 1) / BN_BITS2);

  // If |a| definitely has less than |e| bits, just BN_copy.
  if ((size_t)a->width < num_words) {
    return BN_copy(r, a) != NULL;
  }

  // Otherwise, first make sure we have enough space in |r|.
  // Note that this will fail if num_words > INT_MAX.
  if (!bn_wexpand(r, num_words)) {
    return 0;
  }

  // Copy the content of |a| into |r|.
  OPENSSL_memcpy(r->d, a->d, num_words * sizeof(BN_ULONG));

  // If |e| isn't word-aligned, we have to mask off some of our bits.
  size_t top_word_exponent = e % (sizeof(BN_ULONG) * 8);
  if (top_word_exponent != 0) {
    r->d[num_words - 1] &= (((BN_ULONG)1) << top_word_exponent) - 1;
  }

  // Fill in the remaining fields of |r|.
  r->neg = a->neg;
  r->width = (int)num_words;
  bn_set_minimal_width(r);
  return 1;
}